

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  float *pfVar8;
  float *pfVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  void *pvVar22;
  ulong uVar23;
  int iVar24;
  void *pvVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [16];
  float *outptr;
  Option opt_g;
  long local_138;
  Mat local_108;
  float *local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  void *local_98;
  long local_90;
  InnerProduct *local_88;
  void *local_80;
  Option local_78;
  
  iVar24 = this->weight_data_size;
  iVar2 = this->num_output;
  uVar3 = bottom_blob->c;
  sVar5 = bottom_blob->elemsize;
  local_108.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  local_108.refcount._0_4_ = SUB84(piVar6,0);
  local_108.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_108.elemsize._0_4_ = (undefined4)sVar5;
  local_108.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
  local_108.elempack = bottom_blob->elempack;
  local_108.allocator = bottom_blob->allocator;
  local_108.dims = bottom_blob->dims;
  local_108.w = bottom_blob->w;
  local_108.h = bottom_blob->h;
  local_108.d = bottom_blob->d;
  uVar4 = bottom_blob->w;
  uVar18 = bottom_blob->h;
  local_108.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_108.c = uVar3;
  if (sVar5 != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    uVar23._0_1_ = opt->use_bf16_storage;
    uVar23._1_1_ = opt->use_fp16_packed;
    uVar23._2_1_ = opt->use_fp16_storage;
    uVar23._3_1_ = opt->use_fp16_arithmetic;
    uVar23._4_1_ = opt->use_int8_packed;
    uVar23._5_1_ = opt->use_int8_storage;
    uVar23._6_1_ = opt->use_int8_arithmetic;
    uVar23._7_1_ = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_reserved_0 = opt->use_reserved_0;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_shader_local_memory = opt->use_shader_local_memory;
    local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    local_78._32_8_ = uVar23 & 0xffffffffffffff;
    quantize_to_int8(bottom_blob,&local_108,&this->bottom_blob_int8_scales,&local_78);
  }
  if ((bottom_blob->dims == 2) && (uVar4 == iVar24 / iVar2)) {
    Mat::create(top_blob,this->num_output,uVar18,4,opt->blob_allocator);
    auVar30 = local_a8;
    local_80 = top_blob->data;
    iVar24 = -100;
    if ((local_80 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_002c1fbb;
    if ((int)uVar18 < 1) {
LAB_002c1fb8:
      iVar24 = 0;
      goto LAB_002c1fbb;
    }
    local_90 = (long)top_blob->w * top_blob->elemsize;
    lVar14 = (long)local_108.w;
    uVar3 = this->num_output;
    iVar24 = this->bias_term;
    local_98 = (this->weight_data).data;
    pvVar7 = (this->weight_data_int8_scales).data;
    iVar2 = this->activation_type;
    local_a8._4_4_ = 0;
    local_a8._0_4_ = uVar18;
    local_a8._8_8_ = auVar30._8_8_;
    lVar21 = CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
    local_138 = 0;
    pvVar25 = local_108.data;
    local_88 = this;
    do {
      pvVar17 = local_80;
      if (0 < (int)uVar3) {
        lVar19 = local_90 * local_138;
        pfVar8 = (float *)(local_88->bottom_blob_int8_scales).data;
        pfVar9 = (float *)(local_88->activation_params).data;
        pvVar10 = (local_88->bias_data).data;
        uVar23 = 0;
        pvVar22 = local_98;
        do {
          fVar28 = 0.0;
          fVar26 = 0.0;
          if (0 < (int)uVar4) {
            uVar12 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (int)*(char *)((long)pvVar22 + uVar12) *
                                (int)*(char *)((long)pvVar25 + uVar12);
              uVar12 = uVar12 + 1;
            } while (uVar4 != uVar12);
            fVar26 = (float)iVar13;
          }
          fVar1 = *(float *)((long)pvVar7 + uVar23 * 4);
          if (fVar1 != 0.0) {
            fVar28 = 1.0 / (fVar1 * *pfVar8);
          }
          fVar28 = fVar28 * fVar26;
          if (iVar24 != 0) {
            fVar28 = fVar28 + *(float *)((long)pvVar10 + uVar23 * 4);
          }
          fVar26 = fVar28;
          switch(iVar2) {
          case 1:
            if (fVar28 <= 0.0) {
              fVar26 = 0.0;
            }
            break;
          case 2:
            fVar26 = (float)(~-(uint)(0.0 < fVar28) & (uint)*pfVar9 |
                            -(uint)(0.0 < fVar28) & 0x3f800000) * fVar28;
            break;
          case 3:
            if (fVar28 <= *pfVar9) {
              fVar28 = *pfVar9;
            }
            fVar26 = pfVar9[1];
            if (fVar28 <= pfVar9[1]) {
              fVar26 = fVar28;
            }
            break;
          case 4:
            if (88.37626 <= fVar28) {
              fVar28 = 88.37626;
            }
            fVar26 = expf((float)(-(uint)(fVar28 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar28 < -88.37626) & (uint)-fVar28));
            fVar26 = 1.0 / (fVar26 + 1.0);
            break;
          case 5:
            local_b8 = (float *)(ulong)(uint)fVar28;
            uStack_b0 = 0;
            uStack_ac = 0;
            fVar26 = expf(fVar28);
            fVar26 = logf(fVar26 + 1.0);
            fVar26 = tanhf(fVar26);
            fVar26 = fVar26 * local_b8._0_4_;
            break;
          case 6:
            fVar1 = *pfVar9;
            fVar27 = -pfVar9[1] / fVar1;
            fVar26 = 0.0;
            if ((fVar27 <= fVar28) && (fVar26 = fVar28, fVar28 <= fVar27 + 1.0 / fVar1)) {
              fVar26 = (fVar1 * fVar28 + pfVar9[1]) * fVar28;
            }
          }
          *(float *)((long)pvVar17 + uVar23 * 4 + lVar19) = fVar26;
          uVar23 = uVar23 + 1;
          pvVar22 = (void *)((long)pvVar22 + (long)(int)uVar4);
        } while (uVar23 != uVar3);
      }
      local_138 = local_138 + 1;
      pvVar25 = (void *)((long)pvVar25 + lVar14 * lVar21);
    } while (local_138 != local_a8._0_8_);
  }
  else {
    Mat::create(top_blob,this->num_output,4,opt->blob_allocator);
    pvVar7 = local_108.data;
    iVar24 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_002c1fbb;
    iVar24 = this->num_output;
    if ((long)iVar24 < 1) goto LAB_002c1fb8;
    uVar18 = uVar18 * uVar4;
    pvVar25 = top_blob->data;
    pvVar17 = (this->weight_data).data;
    pvVar10 = (this->weight_data_int8_scales).data;
    pfVar8 = (float *)(this->bottom_blob_int8_scales).data;
    iVar2 = this->bias_term;
    iVar13 = this->activation_type;
    pvVar22 = (this->bias_data).data;
    local_b8 = (float *)(this->activation_params).data;
    lVar21 = local_108.cstep * CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
    lVar14 = 0;
    do {
      fVar26 = 0.0;
      if (0 < (int)uVar3) {
        uVar23 = 0;
        iVar20 = 0;
        pvVar15 = pvVar7;
        pvVar16 = pvVar17;
        do {
          if (0 < (int)uVar18) {
            uVar12 = 0;
            do {
              iVar20 = iVar20 + (int)*(char *)((long)pvVar16 + uVar12) *
                                (int)*(char *)((long)pvVar15 + uVar12);
              uVar12 = uVar12 + 1;
            } while (uVar18 != uVar12);
          }
          uVar23 = uVar23 + 1;
          pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar18);
          pvVar15 = (void *)((long)pvVar15 + lVar21);
        } while (uVar23 != uVar3);
        fVar26 = (float)iVar20;
      }
      fVar28 = *(float *)((long)pvVar10 + lVar14 * 4);
      auVar29 = ZEXT812(0);
      if (fVar28 != 0.0) {
        auVar29._4_8_ = 0;
        auVar29._0_4_ = 1.0 / (fVar28 * *pfVar8);
      }
      uVar23 = auVar29._4_8_;
      fVar26 = auVar29._0_4_ * fVar26;
      if (iVar2 != 0) {
        fVar26 = fVar26 + *(float *)((long)pvVar22 + lVar14 * 4);
      }
      auVar30._4_8_ = uVar23;
      auVar30._0_4_ = fVar26;
      auVar30._12_4_ = 0;
      switch(iVar13) {
      case 1:
        if (fVar26 <= 0.0) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar23;
          auVar30 = auVar11 << 0x20;
        }
      default:
switchD_002c1e44_default:
        fVar28 = auVar30._0_4_;
        break;
      case 2:
        fVar28 = (float)(~-(uint)(0.0 < fVar26) & (uint)*local_b8 |
                        -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
        break;
      case 3:
        if (fVar26 <= *local_b8) {
          auVar30._0_4_ = *local_b8;
          auVar30._12_4_ = 0;
        }
        fVar28 = local_b8[1];
        if (auVar30._0_4_ <= fVar28) {
          fVar28 = auVar30._0_4_;
        }
        break;
      case 4:
        if (88.37626 <= fVar26) {
          fVar26 = 88.37626;
        }
        fVar26 = expf((float)(-(uint)(fVar26 < -88.37626) & 0x42b0c0a5 |
                             ~-(uint)(fVar26 < -88.37626) & (uint)-fVar26));
        fVar28 = 1.0 / (fVar26 + 1.0);
        break;
      case 5:
        local_a8 = auVar30;
        fVar26 = expf(fVar26);
        fVar26 = logf(fVar26 + 1.0);
        fVar26 = tanhf(fVar26);
        fVar28 = fVar26 * (float)local_a8._0_4_;
        break;
      case 6:
        fVar1 = *local_b8;
        fVar27 = -local_b8[1] / fVar1;
        fVar28 = 0.0;
        if (fVar27 <= fVar26) {
          if (fVar27 + 1.0 / fVar1 < fVar26) goto switchD_002c1e44_default;
          fVar28 = (fVar1 * fVar26 + local_b8[1]) * fVar26;
        }
      }
      *(float *)((long)pvVar25 + lVar14 * 4) = fVar28;
      lVar14 = lVar14 + 1;
      pvVar17 = (void *)((long)pvVar17 + (long)(int)(uVar18 * uVar3));
    } while (lVar14 != iVar24);
  }
  iVar24 = 0;
LAB_002c1fbb:
  piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}